

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqcompiler.cpp
# Opt level: O0

void __thiscall
SQCompiler::BIN_EXP<void(SQCompiler::*)()>
          (SQCompiler *this,SQOpcode op,offset_in_SQCompiler_to_subr f,SQInteger op3)

{
  SQFuncState *this_00;
  SQInteger arg1;
  SQInteger arg2;
  SQInteger arg0;
  SQInteger in_R8;
  SQInteger op2;
  SQInteger op1;
  SQInteger op3_local;
  offset_in_SQCompiler_to_subr f_local;
  SQOpcode op_local;
  SQCompiler *this_local;
  
  Lex(this);
  INVOKE_EXP<void(SQCompiler::*)()>(this,f);
  arg1 = SQFuncState::PopTarget(this->_fs);
  arg2 = SQFuncState::PopTarget(this->_fs);
  this_00 = this->_fs;
  arg0 = SQFuncState::PushTarget(this->_fs,-1);
  SQFuncState::AddInstruction(this_00,op,arg0,arg1,arg2,in_R8);
  (this->_es).etype = 1;
  return;
}

Assistant:

void BIN_EXP(SQOpcode op, T f,SQInteger op3 = 0)
    {
        Lex();
        INVOKE_EXP(f);
        SQInteger op1 = _fs->PopTarget();SQInteger op2 = _fs->PopTarget();
        _fs->AddInstruction(op, _fs->PushTarget(), op1, op2, op3);
        _es.etype = EXPR;
    }